

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandUtil.cpp
# Opt level: O2

void __thiscall llbuild::commands::setProgramName(commands *this,StringRef name)

{
  StringRef name_local;
  string local_28;
  
  name_local.Length = (size_t)name.Data;
  name_local.Data = (char *)this;
  if (programName_abi_cxx11_._M_string_length == 0) {
    llvm::StringRef::str_abi_cxx11_(&local_28,&name_local);
    std::__cxx11::string::operator=((string *)&programName_abi_cxx11_,(string *)&local_28);
    std::__cxx11::string::_M_dispose();
    return;
  }
  __assert_fail("programName.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Commands/CommandUtil.cpp"
                ,0x22,"void llbuild::commands::setProgramName(StringRef)");
}

Assistant:

void commands::setProgramName(StringRef name) {
  assert(programName.empty());
  programName = name;
}